

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_parser.cc
# Opt level: O0

void __thiscall
iqxmlrpc::anon_unknown_7::StructBuilder::do_visit_element_end(StructBuilder *this,string *tagname)

{
  Struct *this_00;
  bool bVar1;
  int iVar2;
  XML_RPC_violation *this_01;
  Value *this_02;
  ExplicitPtr<iqxmlrpc::Value_*> local_58;
  ExplicitPtr<iqxmlrpc::Value_*> local_50;
  Value_ptr v;
  string local_38;
  string *local_18;
  string *tagname_local;
  StructBuilder *this_local;
  
  local_18 = tagname;
  tagname_local = (string *)this;
  bVar1 = std::operator==(tagname,"member");
  if (bVar1) {
    iVar2 = StateMachine::get_state(&this->state_);
    if (iVar2 != 3) {
      v.p_._3_1_ = 1;
      this_01 = (XML_RPC_violation *)__cxa_allocate_exception(0x18);
      Parser::context_abi_cxx11_(&local_38,(this->super_ValueBuilderBase).super_BuilderBase.parser_)
      ;
      XML_RPC_violation::XML_RPC_violation(this_01,&local_38);
      v.p_._3_1_ = 0;
      __cxa_throw(this_01,&XML_RPC_violation::typeinfo,XML_RPC_violation::~XML_RPC_violation);
    }
    this_02 = (Value *)operator_new(0x10);
    Value::Value(this_02,this->value_);
    util::ExplicitPtr<iqxmlrpc::Value_*>::ExplicitPtr(&local_50,this_02);
    this_00 = this->proxy_;
    util::ExplicitPtr<iqxmlrpc::Value_*>::ExplicitPtr(&local_58,&local_50);
    Struct::insert(this_00,&this->name_,&local_58);
    util::ExplicitPtr<iqxmlrpc::Value_*>::~ExplicitPtr(&local_58);
    StateMachine::set_state(&this->state_,0);
    util::ExplicitPtr<iqxmlrpc::Value_*>::~ExplicitPtr(&local_50);
  }
  return;
}

Assistant:

virtual void
  do_visit_element_end(const std::string& tagname)
  {
    if (tagname == "member") {
      if (state_.get_state() != VALUE_READ) {
        throw XML_RPC_violation(parser_.context());
      }

      Value_ptr v(new Value(value_));
      proxy_->insert(name_, v);
      state_.set_state(NONE);
    }
  }